

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_utilities.hpp
# Opt level: O2

void __thiscall
Disa::Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
          (Convergence_Data *this,Matrix_Sparse *coef,Vector_Dense<double,_0UL> *solution,
          Vector_Dense<double,_0UL> *constant)

{
  long lVar1;
  pair<double,_double> pVar4;
  double dVar2;
  double dVar3;
  
  pVar4 = compute_residual<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
                    (coef,solution,constant);
  dVar3 = pVar4.second;
  dVar2 = pVar4.first;
  this->residual = dVar2;
  this->residual_max = dVar3;
  if (this->iteration == 0) {
    this->residual_0 = dVar2;
    this->residual_max_0 = dVar3;
  }
  else {
    pVar4.second = this->residual_max_0;
    pVar4.first = this->residual_0;
  }
  this->residual_normalised = dVar2 / pVar4.first;
  this->residual_max_normalised = dVar3 / pVar4.second;
  this->iteration = this->iteration + 1;
  lVar1 = std::chrono::_V2::steady_clock::now();
  (this->duration).__r = (lVar1 - (this->start_time).__d.__r) / 1000;
  return;
}

Assistant:

void Convergence_Data::update(const _matrix& coef, const _vector& solution, const _vector& constant) {

  std::tie(residual, residual_max) = compute_residual(coef, solution, constant);

  if(!iteration) {
    residual_0 = residual;
    residual_max_0 = residual_max;
  }
  residual_normalised = residual / residual_0;
  residual_max_normalised = residual_max / residual_max_0;

  ++iteration;
  duration = std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time);
}